

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O1

void __thiscall fmp4_stream::tfhd::print(tfhd *this)

{
  long lVar1;
  ostream *poVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"=================tfhd==================",0x27);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  lVar1 = std::cout;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x21;
  *(uint *)(std::__cxx11::string::find + *(long *)(lVar1 + -0x18)) =
       *(uint *)(std::__cxx11::string::find + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x20;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," vflags                  ",0x19);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  lVar1 = std::cout;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x21;
  *(uint *)(std::__cxx11::string::find + *(long *)(lVar1 + -0x18)) =
       *(uint *)(std::__cxx11::string::find + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x20;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," track id:                  ",0x1c);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  lVar1 = std::cout;
  if ((this->super_full_box).field_0x6c == '\x01') {
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x21
    ;
    *(uint *)(std::__cxx11::string::find + *(long *)(lVar1 + -0x18)) =
         *(uint *)(std::__cxx11::string::find + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x20;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," base_data_offset: ",0x13);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  lVar1 = std::cout;
  if ((this->super_full_box).field_0x6d == '\x01') {
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x21
    ;
    *(uint *)(std::__cxx11::string::find + *(long *)(lVar1 + -0x18)) =
         *(uint *)(std::__cxx11::string::find + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x20;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," sample description: ",0x15);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  lVar1 = std::cout;
  if ((this->super_full_box).field_0x6e == '\x01') {
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x21
    ;
    *(uint *)(std::__cxx11::string::find + *(long *)(lVar1 + -0x18)) =
         *(uint *)(std::__cxx11::string::find + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x20;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," default sample duration: ",0x1a);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  lVar1 = std::cout;
  if ((this->super_full_box).field_0x6f == '\x01') {
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x21
    ;
    *(uint *)(std::__cxx11::string::find + *(long *)(lVar1 + -0x18)) =
         *(uint *)(std::__cxx11::string::find + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x20;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," default sample size: ",0x16);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  lVar1 = std::cout;
  if (this->default_sample_flags_present_ == true) {
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x21
    ;
    *(uint *)(std::__cxx11::string::find + *(long *)(lVar1 + -0x18)) =
         *(uint *)(std::__cxx11::string::find + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x20;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," default sample flags:  ",0x18);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  lVar1 = std::cout;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x21;
  *(uint *)(std::__cxx11::string::find + *(long *)(lVar1 + -0x18)) =
       *(uint *)(std::__cxx11::string::find + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x20;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," duration is empty ",0x13);
  poVar2 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  lVar1 = std::cout;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x21;
  *(uint *)(std::__cxx11::string::find + *(long *)(lVar1 + -0x18)) =
       *(uint *)(std::__cxx11::string::find + *(long *)(lVar1 + -0x18)) & 0xffffff4f | 0x20;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," default base is moof",0x15);
  poVar2 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return;
}

Assistant:

void tfhd::print() const {
		std::cout << "=================tfhd==================" << std::endl;
		//cout << setw(33) << left << " magic conf                 " << m_magic_conf << endl;
		std::cout << std::setw(33) << std::left << " vflags                  " << flags_ << std::endl;
		std::cout << std::setw(33) << std::left << " track id:                  " << track_id_ << std::endl;
		if (base_data_offset_present_)
			std::cout << std::setw(33) << std::left << " base_data_offset: " << base_data_offset_ << std::endl;
		if (sample_description_index_present_)
			std::cout << std::setw(33) << std::left << " sample description: " << sample_description_index_ << std::endl;
		if (default_sample_duration_present_)
			std::cout << std::setw(33) << std::left << " default sample duration: " << default_sample_duration_ << std::endl;
		if (default_sample_size_present_)
			std::cout << std::setw(33) << std::left << " default sample size: " << default_sample_size_ << std::endl;
		if (default_sample_flags_present_)
			std::cout << std::setw(33) << std::left << " default sample flags:  " << default_sample_flags_ << std::endl;
		std::cout << std::setw(33) << std::left << " duration is empty " << duration_is_empty_ << std::endl;
		std::cout << std::setw(33) << std::left << " default base is moof" << default_base_is_moof_ << std::endl;
		//cout << "............." << std::endl;
	}